

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IfNonePathDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IfNonePathDeclarationSyntax,slang::syntax::IfNonePathDeclarationSyntax_const&>
          (BumpAllocator *this,IfNonePathDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  IfNonePathDeclarationSyntax *pIVar8;
  
  pIVar8 = (IfNonePathDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IfNonePathDeclarationSyntax *)this->endPtr < pIVar8 + 1) {
    pIVar8 = (IfNonePathDeclarationSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pIVar8 + 1);
  }
  (pIVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pIVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pIVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pIVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pIVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pIVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pIVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pIVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00cb68b8;
  (pIVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pIVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pIVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pIVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00cb67f8;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pIVar8->keyword).kind = (args->keyword).kind;
  (pIVar8->keyword).field_0x2 = uVar5;
  (pIVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar8->keyword).rawLen = uVar7;
  (pIVar8->keyword).info = pIVar3;
  (pIVar8->path).ptr = (args->path).ptr;
  return pIVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }